

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,
          SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *this,size_t index)

{
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *__v;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  
  __v = (variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
        (*(long *)((long)&__return_storage_ptr__[2].
                          super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                          super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                          super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                          .
                          super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                  + 8) + (long)this * 0x18);
  if ((__v->super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      _M_index == '\x01') {
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
    pSVar2 = *ppSVar1;
  }
  else {
    pSVar2 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)
             std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
  }
  return (PtrTokenOrSyntax *)pSVar2;
}

Assistant:

PtrTokenOrSyntax getChildPtr(size_t index) final {
        if (elements[index].isNode())
            return elements[index].node();
        else
            return &(std::get<parsing::Token>(elements[index]));
    }